

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_serialization_unit_test.cpp
# Opt level: O3

Vector_filtration_value *
random_filtration_vec<Gudhi::Vector_filtration_value>
          (Vector_filtration_value *__return_storage_ptr__,value_type_conflict1 lower_bound,
          value_type_conflict1 upper_bound,uint number_of_parameters)

{
  uint uVar1;
  result_type rVar2;
  long lVar3;
  ulong uVar4;
  uniform_int_distribution<int> unif;
  mt19937 rand_engine;
  random_device rand_dev;
  allocator_type local_2749;
  uniform_int_distribution<int> local_2748;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  local_2748._M_param._M_a = lower_bound;
  local_2748._M_param._M_b = upper_bound;
  std::random_device::random_device(&local_13b8);
  uVar1 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar1;
  lVar3 = 1;
  uVar4 = local_2740._M_x[0];
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar3);
    local_2740._M_x[lVar3] = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_2740._M_p = 0x270;
  std::vector<int,_std::allocator<int>_>::vector
            (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,
             (ulong)number_of_parameters,&local_2749);
  if (number_of_parameters != 0) {
    uVar4 = 0;
    do {
      rVar2 = std::uniform_int_distribution<int>::operator()
                        (&local_2748,&local_2740,&local_2748._M_param);
      (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar4]
           = rVar2;
      uVar4 = uVar4 + 1;
    } while (number_of_parameters != uVar4);
  }
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

Filtration_type random_filtration_vec(typename Filtration_type::value_type lower_bound = 0,
                                      typename Filtration_type::value_type upper_bound = 10,
                                      unsigned int number_of_parameters = 2)
{
  std::uniform_int_distribution<typename Filtration_type::value_type> unif(lower_bound, upper_bound);
  std::random_device rand_dev;
  std::mt19937 rand_engine(rand_dev());

  Filtration_type res(number_of_parameters);
  for (unsigned int i = 0; i < number_of_parameters; ++i) res[i] = unif(rand_engine);

  return res;
}